

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtPolyhedralContactClipping.cpp
# Opt level: O2

void cbtPolyhedralContactClipping::clipFaceAgainstHull
               (cbtVector3 *separatingNormal,cbtConvexPolyhedron *hullA,cbtTransform *transA,
               cbtVertexArray *worldVertsB1,cbtVertexArray *worldVertsB2,cbtScalar minDist,
               cbtScalar maxDist,Result *resultOut)

{
  int *piVar1;
  uint uVar2;
  cbtFace *pcVar3;
  int *piVar4;
  cbtVector3 *pcVar5;
  float fVar6;
  undefined8 uVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  ulong uVar10;
  int i;
  long lVar11;
  int face;
  ulong uVar12;
  cbtVertexArray *ppVtxOut;
  cbtVector3 *v1;
  long lVar13;
  undefined1 auVar14 [16];
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined4 in_XMM0_Db;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  undefined1 auVar18 [64];
  undefined1 auVar25 [56];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 in_register_00001244 [60];
  undefined1 auVar34 [56];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  cbtVector3 cVar35;
  cbtVertexArray *local_118;
  cbtVector3 Normal;
  uint local_f8;
  cbtVector3 local_d8;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  cbtVector3 WorldEdge0;
  cbtVector3 worldPlaneAnormal1;
  cbtVector3 local_40;
  
  auVar27._4_60_ = in_register_00001244;
  auVar27._0_4_ = maxDist;
  cbtAlignedObjectArray<cbtVector3>::resize(worldVertsB2,0,&Normal);
  cbtAlignedObjectArray<cbtVector3>::reserve(worldVertsB2,worldVertsB1->m_size);
  uVar10 = 0xffffffffffffffff;
  auVar18 = ZEXT464(0x7f7fffff);
  lVar11 = 0x28;
  for (uVar12 = 0; auVar34 = auVar27._8_56_, (long)uVar12 < (long)(hullA->m_faces).m_size;
      uVar12 = uVar12 + 1) {
    pcVar3 = (hullA->m_faces).m_data;
    fVar15 = auVar18._0_4_;
    Normal.m_floats[1] = *(cbtScalar *)((long)pcVar3->m_plane + lVar11 + -0x24);
    Normal.m_floats[0] = *(cbtScalar *)((long)pcVar3->m_plane + lVar11 + -0x28);
    auVar25 = (undefined1  [56])0x0;
    Normal.m_floats[2] = *(cbtScalar *)((long)pcVar3->m_plane + lVar11 + -0x20);
    Normal.m_floats[3] = 0.0;
    cVar35 = ::operator*(&transA->m_basis,&Normal);
    auVar26._0_8_ = cVar35.m_floats._8_8_;
    auVar26._8_56_ = auVar34;
    auVar19._0_8_ = cVar35.m_floats._0_8_;
    auVar19._8_56_ = auVar25;
    auVar14 = vmovshdup_avx(auVar19._0_16_);
    auVar14 = vfmadd231ss_fma(ZEXT416((uint)(auVar14._0_4_ * separatingNormal->m_floats[1])),
                              auVar19._0_16_,ZEXT416((uint)separatingNormal->m_floats[0]));
    auVar17 = vfmadd132ss_fma(auVar26._0_16_,auVar14,ZEXT416((uint)separatingNormal->m_floats[2]));
    auVar27 = ZEXT1664(auVar17);
    auVar14 = vminss_avx(auVar17,ZEXT416((uint)fVar15));
    auVar18 = ZEXT1664(auVar14);
    if (auVar17._0_4_ < fVar15) {
      uVar10 = uVar12;
    }
    uVar10 = uVar10 & 0xffffffff;
    lVar11 = lVar11 + 0x30;
  }
  if (-1 < (int)uVar10) {
    pcVar3 = (hullA->m_faces).m_data;
    uVar10 = uVar10 & 0xffffffff;
    uVar12 = 0;
    uVar2 = pcVar3[uVar10].m_indices.m_size;
    local_118 = worldVertsB1;
    while( true ) {
      ppVtxOut = worldVertsB2;
      auVar25 = auVar27._8_56_;
      auVar34 = auVar18._8_56_;
      if ((~((int)uVar2 >> 0x1f) & uVar2) == uVar12) break;
      piVar4 = pcVar3[uVar10].m_indices.m_data;
      piVar1 = piVar4 + uVar12;
      uVar12 = uVar12 + 1;
      pcVar5 = (hullA->m_vertices).m_data;
      v1 = pcVar5 + *piVar1;
      cVar35 = ::operator-(v1,pcVar5 + piVar4[(long)((ulong)(uint)((int)uVar12 >> 0x1f) << 0x20 |
                                                    uVar12 & 0xffffffff) % (long)(int)uVar2 &
                                              0xffffffff]);
      auVar28._0_8_ = cVar35.m_floats._8_8_;
      auVar28._8_56_ = auVar25;
      auVar20._0_8_ = cVar35.m_floats._0_8_;
      auVar20._8_56_ = auVar34;
      Normal.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar20._0_16_,auVar28._0_16_);
      auVar34 = ZEXT856(Normal.m_floats._8_8_);
      cVar35 = ::operator*(&transA->m_basis,&Normal);
      auVar29._0_8_ = cVar35.m_floats._8_8_;
      auVar29._8_56_ = auVar25;
      auVar21._0_8_ = cVar35.m_floats._0_8_;
      auVar21._8_56_ = auVar34;
      WorldEdge0.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar21._0_16_,auVar29._0_16_);
      auVar34 = (undefined1  [56])0x0;
      local_d8.m_floats[3] = 0.0;
      local_d8.m_floats._0_12_ = *(undefined1 (*) [12])pcVar3[uVar10].m_plane;
      cVar35 = ::operator*(&transA->m_basis,&local_d8);
      auVar30._0_8_ = cVar35.m_floats._8_8_;
      auVar30._8_56_ = auVar25;
      auVar22._0_8_ = cVar35.m_floats._0_8_;
      auVar22._8_56_ = auVar34;
      worldPlaneAnormal1.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar22._0_16_,auVar30._0_16_);
      auVar34 = ZEXT856(worldPlaneAnormal1.m_floats._8_8_);
      cVar35 = cbtVector3::cross(&WorldEdge0,&worldPlaneAnormal1);
      auVar31._0_8_ = cVar35.m_floats._8_8_;
      auVar31._8_56_ = auVar25;
      auVar23._0_8_ = cVar35.m_floats._0_8_;
      auVar23._8_56_ = auVar34;
      local_b8 = auVar23._0_16_;
      local_a8 = auVar31._0_16_;
      local_c8._0_8_ = auVar23._0_8_ ^ 0x8000000080000000;
      local_c8._8_4_ = auVar34._0_4_ ^ 0x80000000;
      local_c8._12_4_ = auVar34._4_4_ ^ 0x80000000;
      auVar16._0_8_ = auVar31._0_8_ ^ 0x8000000080000000;
      auVar16._8_4_ = auVar25._0_4_ ^ 0x80000000;
      auVar16._12_4_ = auVar25._4_4_ ^ 0x80000000;
      auVar34 = ZEXT856(auVar16._8_8_);
      cVar35 = cbtTransform::operator()(transA,v1);
      auVar32._0_8_ = cVar35.m_floats._8_8_;
      auVar32._8_56_ = auVar25;
      auVar24._0_8_ = cVar35.m_floats._0_8_;
      auVar24._8_56_ = auVar34;
      auVar14._0_4_ = cVar35.m_floats[0] * local_c8._0_4_;
      auVar14._4_4_ = cVar35.m_floats[1] * local_c8._4_4_;
      auVar14._8_4_ = auVar34._0_4_ * local_c8._8_4_;
      auVar14._12_4_ = auVar34._4_4_ * local_c8._12_4_;
      auVar14 = vmovshdup_avx(auVar14);
      auVar14 = vfnmadd231ss_fma(auVar14,auVar24._0_16_,ZEXT416((uint)local_b8._0_4_));
      auVar14 = vfnmadd231ss_fma(auVar14,auVar32._0_16_,ZEXT416((uint)local_a8._0_4_));
      local_f8 = (uint)auVar16._0_8_;
      local_d8.m_floats = (cbtScalar  [4])vinsertps_avx(local_c8,ZEXT416(local_f8),0x28);
      auVar27 = ZEXT1664((undefined1  [16])local_d8.m_floats);
      auVar17._8_4_ = 0x80000000;
      auVar17._0_8_ = 0x8000000080000000;
      auVar17._12_4_ = 0x80000000;
      auVar14 = vxorps_avx512vl(auVar14,auVar17);
      auVar18 = ZEXT1664(auVar14);
      clipFace(local_118,ppVtxOut,&local_d8,auVar14._0_4_);
      cbtAlignedObjectArray<cbtVector3>::resize(local_118,0,&local_40);
      worldVertsB2 = local_118;
      local_118 = ppVtxOut;
    }
    Normal.m_floats[3] = 0.0;
    Normal.m_floats._0_12_ = *(undefined1 (*) [12])pcVar3[uVar10].m_plane;
    auVar34 = (undefined1  [56])0x0;
    local_c8._0_4_ = pcVar3[uVar10].m_plane[3];
    cVar35 = ::operator*(&transA->m_basis,&Normal);
    auVar33._0_8_ = cVar35.m_floats._8_8_;
    auVar33._8_56_ = auVar25;
    auVar18._0_8_ = cVar35.m_floats._0_8_;
    auVar18._8_56_ = auVar34;
    auVar17 = auVar18._0_16_;
    local_b8 = vmovshdup_avx(auVar17);
    auVar27 = ZEXT1664(local_b8);
    local_a8 = auVar33._0_16_;
    auVar18 = ZEXT1664(local_a8);
    lVar13 = 0;
    lVar11 = 0;
    auVar14 = vfmadd231ss_fma(ZEXT416((uint)(local_b8._0_4_ * (transA->m_origin).m_floats[1])),
                              auVar17,ZEXT416((uint)(transA->m_origin).m_floats[0]));
    auVar14 = vfmadd231ss_fma(auVar14,local_a8,ZEXT416((uint)(transA->m_origin).m_floats[2]));
    fVar15 = (float)local_c8._0_4_ - auVar14._0_4_;
    for (; lVar11 < local_118->m_size; lVar11 = lVar11 + 1) {
      pcVar5 = local_118->m_data;
      auVar9._4_4_ = in_XMM0_Db;
      auVar9._0_4_ = minDist;
      auVar9._8_4_ = in_XMM0_Dc;
      auVar9._12_4_ = in_XMM0_Dd;
      auVar14 = vfmadd231ss_fma(ZEXT416((uint)(auVar27._0_4_ *
                                              *(float *)((long)pcVar5->m_floats + lVar13 + 4))),
                                auVar17,ZEXT416(*(uint *)((long)pcVar5->m_floats + lVar13)));
      auVar14 = vfmadd231ss_fma(auVar14,auVar18._0_16_,
                                ZEXT416(*(uint *)((long)pcVar5->m_floats + lVar13 + 8)));
      fVar6 = fVar15 + auVar14._0_4_;
      uVar7 = vcmpss_avx512f(ZEXT416((uint)fVar6),auVar9,2);
      bVar8 = (bool)((byte)uVar7 & 1);
      if ((float)((uint)bVar8 * (int)minDist + (uint)!bVar8 * (int)fVar6) <= maxDist) {
        WorldEdge0.m_floats = *(cbtScalar (*) [4])((long)pcVar5->m_floats + lVar13);
        (*resultOut->_vptr_Result[4])(resultOut,separatingNormal,&WorldEdge0);
        auVar27 = ZEXT1664(local_b8);
        auVar18 = ZEXT1664(local_a8);
      }
      lVar13 = lVar13 + 0x10;
    }
  }
  return;
}

Assistant:

void cbtPolyhedralContactClipping::clipFaceAgainstHull(const cbtVector3& separatingNormal, const cbtConvexPolyhedron& hullA, const cbtTransform& transA, cbtVertexArray& worldVertsB1, cbtVertexArray& worldVertsB2, const cbtScalar minDist, cbtScalar maxDist, cbtDiscreteCollisionDetectorInterface::Result& resultOut)
{
	worldVertsB2.resize(0);
	cbtVertexArray* pVtxIn = &worldVertsB1;
	cbtVertexArray* pVtxOut = &worldVertsB2;
	pVtxOut->reserve(pVtxIn->size());

	int closestFaceA = -1;
	{
		cbtScalar dmin = FLT_MAX;
		for (int face = 0; face < hullA.m_faces.size(); face++)
		{
			const cbtVector3 Normal(hullA.m_faces[face].m_plane[0], hullA.m_faces[face].m_plane[1], hullA.m_faces[face].m_plane[2]);
			const cbtVector3 faceANormalWS = transA.getBasis() * Normal;

			cbtScalar d = faceANormalWS.dot(separatingNormal);
			if (d < dmin)
			{
				dmin = d;
				closestFaceA = face;
			}
		}
	}
	if (closestFaceA < 0)
		return;

	const cbtFace& polyA = hullA.m_faces[closestFaceA];

	// clip polygon to back of planes of all faces of hull A that are adjacent to witness face
	int numVerticesA = polyA.m_indices.size();
	for (int e0 = 0; e0 < numVerticesA; e0++)
	{
		const cbtVector3& a = hullA.m_vertices[polyA.m_indices[e0]];
		const cbtVector3& b = hullA.m_vertices[polyA.m_indices[(e0 + 1) % numVerticesA]];
		const cbtVector3 edge0 = a - b;
		const cbtVector3 WorldEdge0 = transA.getBasis() * edge0;
		cbtVector3 worldPlaneAnormal1 = transA.getBasis() * cbtVector3(polyA.m_plane[0], polyA.m_plane[1], polyA.m_plane[2]);

		cbtVector3 planeNormalWS1 = -WorldEdge0.cross(worldPlaneAnormal1);  //.cross(WorldEdge0);
		cbtVector3 worldA1 = transA * a;
		cbtScalar planeEqWS1 = -worldA1.dot(planeNormalWS1);

//int otherFace=0;
#ifdef BLA1
		int otherFace = polyA.m_connectedFaces[e0];
		cbtVector3 localPlaneNormal(hullA.m_faces[otherFace].m_plane[0], hullA.m_faces[otherFace].m_plane[1], hullA.m_faces[otherFace].m_plane[2]);
		cbtScalar localPlaneEq = hullA.m_faces[otherFace].m_plane[3];

		cbtVector3 planeNormalWS = transA.getBasis() * localPlaneNormal;
		cbtScalar planeEqWS = localPlaneEq - planeNormalWS.dot(transA.getOrigin());
#else
		cbtVector3 planeNormalWS = planeNormalWS1;
		cbtScalar planeEqWS = planeEqWS1;

#endif
		//clip face

		clipFace(*pVtxIn, *pVtxOut, planeNormalWS, planeEqWS);
		cbtSwap(pVtxIn, pVtxOut);
		pVtxOut->resize(0);
	}

	//#define ONLY_REPORT_DEEPEST_POINT

	cbtVector3 point;

	// only keep points that are behind the witness face
	{
		cbtVector3 localPlaneNormal(polyA.m_plane[0], polyA.m_plane[1], polyA.m_plane[2]);
		cbtScalar localPlaneEq = polyA.m_plane[3];
		cbtVector3 planeNormalWS = transA.getBasis() * localPlaneNormal;
		cbtScalar planeEqWS = localPlaneEq - planeNormalWS.dot(transA.getOrigin());
		for (int i = 0; i < pVtxIn->size(); i++)
		{
			cbtVector3 vtx = pVtxIn->at(i);
			cbtScalar depth = planeNormalWS.dot(vtx) + planeEqWS;
			if (depth <= minDist)
			{
				//				printf("clamped: depth=%f to minDist=%f\n",depth,minDist);
				depth = minDist;
			}

			if (depth <= maxDist)
			{
				cbtVector3 point = pVtxIn->at(i);
#ifdef ONLY_REPORT_DEEPEST_POINT
				curMaxDist = depth;
#else
#if 0
				if (depth<-3)
				{
					printf("error in cbtPolyhedralContactClipping depth = %f\n", depth);
					printf("likely wrong separatingNormal passed in\n");
				}
#endif
				resultOut.addContactPoint(separatingNormal, point, depth);
#endif
			}
		}
	}
#ifdef ONLY_REPORT_DEEPEST_POINT
	if (curMaxDist < maxDist)
	{
		resultOut.addContactPoint(separatingNormal, point, curMaxDist);
	}
#endif  //ONLY_REPORT_DEEPEST_POINT
}